

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive.cpp
# Opt level: O1

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::PrimitiveHandle::Intersect
          (optional<pbrt::ShapeIntersection> *__return_storage_ptr__,PrimitiveHandle *this,Ray *r,
          Float tMax)

{
  ulong uVar1;
  ushort uVar2;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
          ).bits;
  uVar2 = (ushort)(uVar1 >> 0x30);
  if (uVar1 >> 0x32 == 0) {
    if (uVar1 >> 0x31 == 0) {
      SimplePrimitive::Intersect
                (__return_storage_ptr__,(SimplePrimitive *)(uVar1 & 0xffffffffffff),r,tMax);
    }
    else if (uVar2 < 3) {
      GeometricPrimitive::Intersect
                (__return_storage_ptr__,(GeometricPrimitive *)(uVar1 & 0xffffffffffff),r,tMax);
    }
    else {
      TransformedPrimitive::Intersect
                (__return_storage_ptr__,(TransformedPrimitive *)(uVar1 & 0xffffffffffff),r,tMax);
    }
  }
  else if (uVar2 < 5) {
    AnimatedPrimitive::Intersect
              (__return_storage_ptr__,(AnimatedPrimitive *)(uVar1 & 0xffffffffffff),r,tMax);
  }
  else if ((uint)(uVar1 >> 0x31) < 3) {
    BVHAggregate::Intersect(__return_storage_ptr__,(BVHAggregate *)(uVar1 & 0xffffffffffff),r,tMax);
  }
  else {
    KdTreeAggregate::Intersect
              (__return_storage_ptr__,(KdTreeAggregate *)(uVar1 & 0xffffffffffff),r,tMax);
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<ShapeIntersection> PrimitiveHandle::Intersect(const Ray &r,
                                                             Float tMax) const {
    auto isect = [&](auto ptr) { return ptr->Intersect(r, tMax); };
    return DispatchCPU(isect);
}